

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spgmr.c
# Opt level: O1

int SUNLinSolSetScalingVectors_SPGMR(SUNLinearSolver S,N_Vector s1,N_Vector s2)

{
  void *pvVar1;
  
  if (S != (SUNLinearSolver)0x0) {
    pvVar1 = S->content;
    *(N_Vector *)((long)pvVar1 + 0x50) = s1;
    *(N_Vector *)((long)pvVar1 + 0x58) = s2;
    *(undefined8 *)((long)pvVar1 + 0x20) = 0;
    return 0;
  }
  return -1;
}

Assistant:

int SUNLinSolSetScalingVectors_SPGMR(SUNLinearSolver S, N_Vector s1,
                                     N_Vector s2)
{
  /* set N_Vector pointers to integrator-supplied scaling vectors, 
     and return with success */
  if (S == NULL) return(SUNLS_MEM_NULL);
  SPGMR_CONTENT(S)->s1 = s1;
  SPGMR_CONTENT(S)->s2 = s2;
  LASTFLAG(S) = SUNLS_SUCCESS;
  return(LASTFLAG(S));
}